

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<4,_1048576,_false,_embree::avx2::ArrayIntersector1<embree::avx2::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ulong uVar18;
  BaseNode *node;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  undefined4 uVar22;
  uint uVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  Scene *pSVar27;
  undefined4 uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  vint4 bi;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  vint4 ai;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar91;
  float fVar92;
  undefined1 auVar90 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar106 [64];
  UVIdentity<4> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_ad9;
  undefined8 local_ad8;
  float fStack_ad0;
  float fStack_acc;
  int local_abc;
  undefined1 local_ab8 [16];
  RayQueryContext *local_aa0;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  ulong *local_a30;
  long local_a28;
  long local_a20;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined4 local_a04;
  uint local_a00;
  uint local_9fc;
  uint local_9f8;
  RTCFilterFunctionNArguments local_9e8;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [16];
  undefined1 local_918 [16];
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  undefined1 *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8[0] != 8) {
    fVar4 = ray->tfar;
    if (0.0 <= fVar4) {
      puVar29 = local_7d8 + 1;
      auVar32 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar5 = (ray->dir).field_0;
      local_998._8_4_ = 0x7fffffff;
      local_998._0_8_ = 0x7fffffff7fffffff;
      local_998._12_4_ = 0x7fffffff;
      auVar61 = vandps_avx((undefined1  [16])aVar5,local_998);
      auVar66._8_4_ = 0x219392ef;
      auVar66._0_8_ = 0x219392ef219392ef;
      auVar66._12_4_ = 0x219392ef;
      auVar61 = vcmpps_avx(auVar61,auVar66,1);
      auVar61 = vblendvps_avx((undefined1  [16])aVar5,auVar66,auVar61);
      auVar66 = vrcpps_avx(auVar61);
      auVar67._8_4_ = 0x3f800000;
      auVar67._0_8_ = 0x3f8000003f800000;
      auVar67._12_4_ = 0x3f800000;
      auVar61 = vfnmadd213ps_fma(auVar61,auVar66,auVar67);
      auVar67 = vfmadd132ps_fma(auVar61,auVar66,auVar66);
      fVar51 = auVar67._0_4_;
      local_918._4_4_ = fVar51;
      local_918._0_4_ = fVar51;
      local_918._8_4_ = fVar51;
      local_918._12_4_ = fVar51;
      auVar90 = ZEXT1664(local_918);
      auVar61 = vmovshdup_avx(auVar67);
      local_928 = vshufps_avx(auVar67,auVar67,0x55);
      auVar95 = ZEXT1664(local_928);
      auVar66 = vshufpd_avx(auVar67,auVar67,1);
      local_938 = vshufps_avx(auVar67,auVar67,0xaa);
      auVar96 = ZEXT1664(local_938);
      auVar52._0_4_ = fVar51 * (ray->org).field_0.m128[0];
      auVar52._4_4_ = auVar67._4_4_ * (ray->org).field_0.m128[1];
      auVar52._8_4_ = auVar67._8_4_ * (ray->org).field_0.m128[2];
      auVar52._12_4_ = auVar67._12_4_ * (ray->org).field_0.m128[3];
      auVar67 = vshufps_avx(auVar52,auVar52,0x55);
      auVar44 = vshufps_avx(auVar52,auVar52,0xaa);
      uVar26 = (ulong)(fVar51 < 0.0) << 2;
      uVar1 = (ulong)(auVar61._0_4_ < 0.0) * 4 + 8;
      uVar2 = (ulong)(auVar66._0_4_ < 0.0) * 4 + 0x10;
      uVar30 = uVar26 ^ 4;
      local_9a8._8_4_ = 0x80000000;
      local_9a8._0_8_ = 0x8000000080000000;
      local_9a8._12_4_ = 0x80000000;
      uVar31 = CONCAT44(auVar52._0_4_,auVar52._0_4_);
      local_948._0_8_ = uVar31 ^ 0x8000000080000000;
      local_948._8_4_ = -auVar52._0_4_;
      local_948._12_4_ = -auVar52._0_4_;
      auVar98 = ZEXT1664(local_948);
      local_958._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
      local_958._8_4_ = auVar67._8_4_ ^ 0x80000000;
      local_958._12_4_ = auVar67._12_4_ ^ 0x80000000;
      auVar99 = ZEXT1664(local_958);
      local_968._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      local_968._8_4_ = auVar44._8_4_ ^ 0x80000000;
      local_968._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar102 = ZEXT1664(local_968);
      uVar22 = auVar32._0_4_;
      local_978._4_4_ = uVar22;
      local_978._0_4_ = uVar22;
      local_978._8_4_ = uVar22;
      local_978._12_4_ = uVar22;
      auVar104 = ZEXT1664(local_978);
      local_988._4_4_ = fVar4;
      local_988._0_4_ = fVar4;
      local_988._8_4_ = fVar4;
      local_988._12_4_ = fVar4;
      auVar106 = ZEXT1664(local_988);
      local_9b8 = mm_lookupmask_ps._240_16_;
      local_aa0 = context;
LAB_014a19a2:
      if (puVar29 != local_7d8) {
        uVar31 = puVar29[-1];
        puVar29 = puVar29 + -1;
        while ((uVar31 & 8) == 0) {
          uVar19 = uVar31 & 0xfffffffffffffff0;
          puVar24 = (ulong *)(uVar19 + 0x20);
          if (uVar19 == 0) {
            puVar24 = (ulong *)0x0;
          }
          uVar22 = (undefined4)puVar24[3];
          auVar44._4_4_ = uVar22;
          auVar44._0_4_ = uVar22;
          auVar44._8_4_ = uVar22;
          auVar44._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)puVar24 + 0x24);
          auVar53._4_4_ = uVar22;
          auVar53._0_4_ = uVar22;
          auVar53._8_4_ = uVar22;
          auVar53._12_4_ = uVar22;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)((long)puVar24 + uVar26);
          auVar61 = vpmovzxbd_avx(auVar61);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar66 = vfmadd213ps_fma(auVar61,auVar53,auVar44);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)((long)puVar24 + uVar30);
          auVar61 = vpmovzxbd_avx(auVar32);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar67 = vfmadd213ps_fma(auVar61,auVar53,auVar44);
          uVar22 = *(undefined4 *)((long)puVar24 + 0x1c);
          auVar58._4_4_ = uVar22;
          auVar58._0_4_ = uVar22;
          auVar58._8_4_ = uVar22;
          auVar58._12_4_ = uVar22;
          uVar22 = (undefined4)puVar24[5];
          auVar68._4_4_ = uVar22;
          auVar68._0_4_ = uVar22;
          auVar68._8_4_ = uVar22;
          auVar68._12_4_ = uVar22;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)((long)puVar24 + uVar1);
          auVar61 = vpmovzxbd_avx(auVar45);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar44 = vfmadd213ps_fma(auVar61,auVar68,auVar58);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)((long)puVar24 + (uVar1 ^ 4));
          auVar61 = vpmovzxbd_avx(auVar46);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar52 = vfmadd213ps_fma(auVar61,auVar68,auVar58);
          uVar22 = (undefined4)puVar24[4];
          auVar59._4_4_ = uVar22;
          auVar59._0_4_ = uVar22;
          auVar59._8_4_ = uVar22;
          auVar59._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)puVar24 + 0x2c);
          auVar69._4_4_ = uVar22;
          auVar69._0_4_ = uVar22;
          auVar69._8_4_ = uVar22;
          auVar69._12_4_ = uVar22;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *(ulong *)((long)puVar24 + uVar2);
          auVar61 = vpmovzxbd_avx(auVar77);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar45 = vfmadd213ps_fma(auVar61,auVar69,auVar59);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = *(ulong *)((long)puVar24 + (uVar2 ^ 4));
          auVar61 = vpmovzxbd_avx(auVar83);
          auVar61 = vcvtdq2ps_avx(auVar61);
          auVar46 = vfmadd213ps_fma(auVar61,auVar69,auVar59);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *puVar24;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)((long)puVar24 + 4);
          auVar32 = vpminub_avx(auVar60,auVar70);
          auVar61 = vpcmpeqb_avx(auVar60,auVar32);
          auVar32 = vpcmpeqd_avx(auVar32,auVar32);
          auVar61 = vpmovzxbd_avx(auVar61 ^ auVar32);
          auVar61 = vpslld_avx(auVar61 ^ auVar32,0x1f);
          uVar28 = vmovmskps_avx(auVar61);
          auVar61 = vfmadd213ps_fma(auVar66,auVar90._0_16_,auVar98._0_16_);
          auVar32 = vfmadd213ps_fma(auVar44,auVar95._0_16_,auVar99._0_16_);
          auVar61 = vpmaxsd_avx(auVar61,auVar32);
          auVar32 = vfmadd213ps_fma(auVar45,auVar96._0_16_,auVar102._0_16_);
          auVar32 = vpmaxsd_avx(auVar32,auVar104._0_16_);
          auVar61 = vpmaxsd_avx(auVar61,auVar32);
          auVar32 = vfmadd213ps_fma(auVar67,auVar90._0_16_,auVar98._0_16_);
          auVar66 = vfmadd213ps_fma(auVar52,auVar95._0_16_,auVar99._0_16_);
          auVar32 = vpminsd_avx(auVar32,auVar66);
          auVar66 = vfmadd213ps_fma(auVar46,auVar96._0_16_,auVar102._0_16_);
          auVar66 = vpminsd_avx(auVar66,auVar106._0_16_);
          auVar32 = vpminsd_avx(auVar32,auVar66);
          auVar61 = vpcmpgtd_avx(auVar61,auVar32);
          uVar22 = vmovmskps_avx(auVar61);
          bVar21 = ~(byte)uVar22 & (byte)uVar28;
          if (bVar21 == 0) goto LAB_014a19a2;
          lVar20 = 0;
          for (uVar31 = (ulong)bVar21; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000)
          {
            lVar20 = lVar20 + 1;
          }
          uVar31 = *(ulong *)(uVar19 + lVar20 * 8);
          uVar23 = bVar21 - 1 & (uint)bVar21;
          uVar25 = (ulong)uVar23;
          if (uVar23 != 0) {
            do {
              *puVar29 = uVar31;
              puVar29 = puVar29 + 1;
              lVar20 = 0;
              for (uVar31 = uVar25; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar20 = lVar20 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              uVar31 = *(ulong *)(uVar19 + lVar20 * 8);
            } while (uVar25 != 0);
          }
        }
        local_a20 = (ulong)((uint)uVar31 & 0xf) - 8;
        uVar31 = uVar31 & 0xfffffffffffffff0;
        for (local_a28 = 0; local_a28 != local_a20; local_a28 = local_a28 + 1) {
          lVar20 = local_a28 * 0x50;
          pSVar27 = context->scene;
          ppfVar6 = (pSVar27->vertices).items;
          pfVar7 = ppfVar6[*(uint *)(uVar31 + 0x30 + lVar20)];
          pfVar8 = ppfVar6[*(uint *)(uVar31 + 0x34 + lVar20)];
          pfVar9 = ppfVar6[*(uint *)(uVar31 + 0x38 + lVar20)];
          pfVar10 = ppfVar6[*(uint *)(uVar31 + 0x3c + lVar20)];
          auVar66 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar20)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar20)));
          auVar61 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + lVar20)),
                                  *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar31 + 8 + lVar20)));
          auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar20)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar31 + 0xc + lVar20))
                                 );
          auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 4 + lVar20)),
                                  *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar31 + 0xc + lVar20))
                                 );
          auVar52 = vunpcklps_avx(auVar61,auVar32);
          auVar45 = vunpcklps_avx(auVar66,auVar67);
          auVar61 = vunpckhps_avx(auVar66,auVar67);
          auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x10 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar20)));
          auVar32 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x10 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar31 + 0x18 + lVar20)));
          auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 0x14 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar20)));
          auVar66 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 0x14 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar31 + 0x1c + lVar20)));
          auVar46 = vunpcklps_avx(auVar32,auVar66);
          auVar53 = vunpcklps_avx(auVar67,auVar44);
          auVar32 = vunpckhps_avx(auVar67,auVar44);
          auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x20 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar20)));
          auVar66 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar31 + 0x20 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar31 + 0x28 + lVar20)));
          auVar58 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 0x24 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar20)));
          auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar31 + 0x24 + lVar20))
                                  ,*(undefined1 (*) [16])
                                    (pfVar10 + *(uint *)(uVar31 + 0x2c + lVar20)));
          auVar59 = vunpcklps_avx(auVar66,auVar67);
          auVar67 = vunpcklps_avx(auVar44,auVar58);
          auVar44 = vunpckhps_avx(auVar44,auVar58);
          puVar3 = (undefined8 *)(uVar31 + 0x30 + lVar20);
          local_898 = *puVar3;
          uStack_890 = puVar3[1];
          puVar3 = (undefined8 *)(uVar31 + 0x40 + lVar20);
          local_8a8 = *puVar3;
          uStack_8a0 = puVar3[1];
          uVar22 = *(undefined4 *)&(ray->org).field_0;
          auVar97._4_4_ = uVar22;
          auVar97._0_4_ = uVar22;
          auVar97._8_4_ = uVar22;
          auVar97._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
          auVar100._4_4_ = uVar22;
          auVar100._0_4_ = uVar22;
          auVar100._8_4_ = uVar22;
          auVar100._12_4_ = uVar22;
          uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
          auVar103._4_4_ = uVar22;
          auVar103._0_4_ = uVar22;
          auVar103._8_4_ = uVar22;
          auVar103._12_4_ = uVar22;
          local_a48 = vsubps_avx(auVar45,auVar97);
          local_a58 = vsubps_avx(auVar61,auVar100);
          local_a68 = vsubps_avx(auVar52,auVar103);
          auVar61 = vsubps_avx(auVar53,auVar97);
          auVar32 = vsubps_avx(auVar32,auVar100);
          auVar66 = vsubps_avx(auVar46,auVar103);
          auVar67 = vsubps_avx(auVar67,auVar97);
          auVar44 = vsubps_avx(auVar44,auVar100);
          auVar52 = vsubps_avx(auVar59,auVar103);
          local_a78 = vsubps_avx(auVar67,local_a48);
          local_a98 = vsubps_avx(auVar44,local_a58);
          local_a88 = vsubps_avx(auVar52,local_a68);
          auVar33._0_4_ = auVar67._0_4_ + local_a48._0_4_;
          auVar33._4_4_ = auVar67._4_4_ + local_a48._4_4_;
          auVar33._8_4_ = auVar67._8_4_ + local_a48._8_4_;
          auVar33._12_4_ = auVar67._12_4_ + local_a48._12_4_;
          auVar54._0_4_ = auVar44._0_4_ + local_a58._0_4_;
          auVar54._4_4_ = auVar44._4_4_ + local_a58._4_4_;
          auVar54._8_4_ = auVar44._8_4_ + local_a58._8_4_;
          auVar54._12_4_ = auVar44._12_4_ + local_a58._12_4_;
          fVar4 = local_a68._0_4_;
          auVar62._0_4_ = auVar52._0_4_ + fVar4;
          fVar51 = local_a68._4_4_;
          auVar62._4_4_ = auVar52._4_4_ + fVar51;
          fVar12 = local_a68._8_4_;
          auVar62._8_4_ = auVar52._8_4_ + fVar12;
          fVar13 = local_a68._12_4_;
          auVar62._12_4_ = auVar52._12_4_ + fVar13;
          auVar101._0_4_ = local_a88._0_4_ * auVar54._0_4_;
          auVar101._4_4_ = local_a88._4_4_ * auVar54._4_4_;
          auVar101._8_4_ = local_a88._8_4_ * auVar54._8_4_;
          auVar101._12_4_ = local_a88._12_4_ * auVar54._12_4_;
          auVar46 = vfmsub231ps_fma(auVar101,local_a98,auVar62);
          auVar63._0_4_ = local_a78._0_4_ * auVar62._0_4_;
          auVar63._4_4_ = local_a78._4_4_ * auVar62._4_4_;
          auVar63._8_4_ = local_a78._8_4_ * auVar62._8_4_;
          auVar63._12_4_ = local_a78._12_4_ * auVar62._12_4_;
          auVar45 = vfmsub231ps_fma(auVar63,local_a88,auVar33);
          auVar34._0_4_ = local_a98._0_4_ * auVar33._0_4_;
          auVar34._4_4_ = local_a98._4_4_ * auVar33._4_4_;
          auVar34._8_4_ = local_a98._8_4_ * auVar33._8_4_;
          auVar34._12_4_ = local_a98._12_4_ * auVar33._12_4_;
          auVar53 = vfmsub231ps_fma(auVar34,local_a78,auVar54);
          local_ad8._4_4_ = (ray->dir).field_0.m128[2];
          auVar35._0_4_ = local_ad8._4_4_ * auVar53._0_4_;
          auVar35._4_4_ = local_ad8._4_4_ * auVar53._4_4_;
          auVar35._8_4_ = local_ad8._4_4_ * auVar53._8_4_;
          auVar35._12_4_ = local_ad8._4_4_ * auVar53._12_4_;
          uVar22 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
          auVar94._4_4_ = uVar22;
          auVar94._0_4_ = uVar22;
          auVar94._8_4_ = uVar22;
          auVar94._12_4_ = uVar22;
          auVar45 = vfmadd231ps_fma(auVar35,auVar94,auVar45);
          uVar22 = *(undefined4 *)&(ray->dir).field_0;
          local_ab8._4_4_ = uVar22;
          local_ab8._0_4_ = uVar22;
          local_ab8._8_4_ = uVar22;
          local_ab8._12_4_ = uVar22;
          local_8e8 = vfmadd231ps_fma(auVar45,local_ab8,auVar46);
          local_8b8 = vsubps_avx(local_a58,auVar32);
          local_8d8 = vsubps_avx(local_a68,auVar66);
          auVar55._0_4_ = auVar32._0_4_ + local_a58._0_4_;
          auVar55._4_4_ = auVar32._4_4_ + local_a58._4_4_;
          auVar55._8_4_ = auVar32._8_4_ + local_a58._8_4_;
          auVar55._12_4_ = auVar32._12_4_ + local_a58._12_4_;
          auVar84._0_4_ = auVar66._0_4_ + fVar4;
          auVar84._4_4_ = auVar66._4_4_ + fVar51;
          auVar84._8_4_ = auVar66._8_4_ + fVar12;
          auVar84._12_4_ = auVar66._12_4_ + fVar13;
          fVar14 = local_8d8._0_4_;
          auVar78._0_4_ = auVar55._0_4_ * fVar14;
          fVar15 = local_8d8._4_4_;
          auVar78._4_4_ = auVar55._4_4_ * fVar15;
          fVar16 = local_8d8._8_4_;
          auVar78._8_4_ = auVar55._8_4_ * fVar16;
          fVar17 = local_8d8._12_4_;
          auVar78._12_4_ = auVar55._12_4_ * fVar17;
          auVar46 = vfmsub231ps_fma(auVar78,local_8b8,auVar84);
          local_8c8 = vsubps_avx(local_a48,auVar61);
          fVar105 = local_8c8._0_4_;
          auVar85._0_4_ = fVar105 * auVar84._0_4_;
          fVar107 = local_8c8._4_4_;
          auVar85._4_4_ = fVar107 * auVar84._4_4_;
          fVar108 = local_8c8._8_4_;
          auVar85._8_4_ = fVar108 * auVar84._8_4_;
          fVar109 = local_8c8._12_4_;
          auVar85._12_4_ = fVar109 * auVar84._12_4_;
          auVar38._0_4_ = auVar61._0_4_ + local_a48._0_4_;
          auVar38._4_4_ = auVar61._4_4_ + local_a48._4_4_;
          auVar38._8_4_ = auVar61._8_4_ + local_a48._8_4_;
          auVar38._12_4_ = auVar61._12_4_ + local_a48._12_4_;
          auVar45 = vfmsub231ps_fma(auVar85,local_8d8,auVar38);
          fVar87 = local_8b8._0_4_;
          auVar64._0_4_ = fVar87 * auVar38._0_4_;
          fVar91 = local_8b8._4_4_;
          auVar64._4_4_ = fVar91 * auVar38._4_4_;
          fVar92 = local_8b8._8_4_;
          auVar64._8_4_ = fVar92 * auVar38._8_4_;
          fVar93 = local_8b8._12_4_;
          auVar64._12_4_ = fVar93 * auVar38._12_4_;
          auVar53 = vfmsub231ps_fma(auVar64,local_8c8,auVar55);
          auVar65._0_4_ = local_ad8._4_4_ * auVar53._0_4_;
          auVar65._4_4_ = local_ad8._4_4_ * auVar53._4_4_;
          auVar65._8_4_ = local_ad8._4_4_ * auVar53._8_4_;
          auVar65._12_4_ = local_ad8._4_4_ * auVar53._12_4_;
          auVar45 = vfmadd231ps_fma(auVar65,auVar94,auVar45);
          local_878 = vfmadd231ps_fma(auVar45,local_ab8,auVar46);
          auVar45 = vsubps_avx(auVar61,auVar67);
          auVar47._0_4_ = auVar61._0_4_ + auVar67._0_4_;
          auVar47._4_4_ = auVar61._4_4_ + auVar67._4_4_;
          auVar47._8_4_ = auVar61._8_4_ + auVar67._8_4_;
          auVar47._12_4_ = auVar61._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar32,auVar44);
          auVar39._0_4_ = auVar32._0_4_ + auVar44._0_4_;
          auVar39._4_4_ = auVar32._4_4_ + auVar44._4_4_;
          auVar39._8_4_ = auVar32._8_4_ + auVar44._8_4_;
          auVar39._12_4_ = auVar32._12_4_ + auVar44._12_4_;
          auVar44 = vsubps_avx(auVar66,auVar52);
          auVar71._0_4_ = auVar66._0_4_ + auVar52._0_4_;
          auVar71._4_4_ = auVar66._4_4_ + auVar52._4_4_;
          auVar71._8_4_ = auVar66._8_4_ + auVar52._8_4_;
          auVar71._12_4_ = auVar66._12_4_ + auVar52._12_4_;
          auVar79._0_4_ = auVar44._0_4_ * auVar39._0_4_;
          auVar79._4_4_ = auVar44._4_4_ * auVar39._4_4_;
          auVar79._8_4_ = auVar44._8_4_ * auVar39._8_4_;
          auVar79._12_4_ = auVar44._12_4_ * auVar39._12_4_;
          auVar32 = vfmsub231ps_fma(auVar79,auVar67,auVar71);
          auVar72._0_4_ = auVar71._0_4_ * auVar45._0_4_;
          auVar72._4_4_ = auVar71._4_4_ * auVar45._4_4_;
          auVar72._8_4_ = auVar71._8_4_ * auVar45._8_4_;
          auVar72._12_4_ = auVar71._12_4_ * auVar45._12_4_;
          auVar61 = vfmsub231ps_fma(auVar72,auVar44,auVar47);
          auVar48._0_4_ = auVar67._0_4_ * auVar47._0_4_;
          auVar48._4_4_ = auVar67._4_4_ * auVar47._4_4_;
          auVar48._8_4_ = auVar67._8_4_ * auVar47._8_4_;
          auVar48._12_4_ = auVar67._12_4_ * auVar47._12_4_;
          auVar66 = vfmsub231ps_fma(auVar48,auVar45,auVar39);
          local_ad8._0_4_ = local_ad8._4_4_;
          fStack_ad0 = local_ad8._4_4_;
          fStack_acc = local_ad8._4_4_;
          auVar40._0_4_ = local_ad8._4_4_ * auVar66._0_4_;
          auVar40._4_4_ = local_ad8._4_4_ * auVar66._4_4_;
          auVar40._8_4_ = local_ad8._4_4_ * auVar66._8_4_;
          auVar40._12_4_ = local_ad8._4_4_ * auVar66._12_4_;
          auVar61 = vfmadd231ps_fma(auVar40,auVar94,auVar61);
          auVar66 = vfmadd231ps_fma(auVar61,local_ab8,auVar32);
          local_888 = local_8e8._0_4_;
          fStack_884 = local_8e8._4_4_;
          fStack_880 = local_8e8._8_4_;
          fStack_87c = local_8e8._12_4_;
          local_868._0_4_ = auVar66._0_4_ + local_888 + local_878._0_4_;
          local_868._4_4_ = auVar66._4_4_ + fStack_884 + local_878._4_4_;
          local_868._8_4_ = auVar66._8_4_ + fStack_880 + local_878._8_4_;
          local_868._12_4_ = auVar66._12_4_ + fStack_87c + local_878._12_4_;
          auVar61 = vminps_avx(local_8e8,local_878);
          auVar61 = vminps_avx(auVar61,auVar66);
          local_8f8 = vandps_avx(local_868,local_998);
          auVar73._0_4_ = local_8f8._0_4_ * 1.1920929e-07;
          auVar73._4_4_ = local_8f8._4_4_ * 1.1920929e-07;
          auVar73._8_4_ = local_8f8._8_4_ * 1.1920929e-07;
          auVar73._12_4_ = local_8f8._12_4_ * 1.1920929e-07;
          auVar80._0_4_ = (uint)auVar73._0_4_ ^ local_9a8._0_4_;
          auVar80._4_4_ = (uint)auVar73._4_4_ ^ local_9a8._4_4_;
          auVar80._8_4_ = (uint)auVar73._8_4_ ^ local_9a8._8_4_;
          auVar80._12_4_ = (uint)auVar73._12_4_ ^ local_9a8._12_4_;
          auVar61 = vcmpps_avx(auVar61,auVar80,5);
          auVar32 = vmaxps_avx(local_8e8,local_878);
          auVar32 = vmaxps_avx(auVar32,auVar66);
          auVar32 = vcmpps_avx(auVar32,auVar73,2);
          local_908 = vorps_avx(auVar61,auVar32);
          local_ad9 = 0;
          auVar61 = local_9b8 & local_908;
          if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar61[0xf] < '\0') {
            auVar41._0_4_ = local_a88._0_4_ * fVar87;
            auVar41._4_4_ = local_a88._4_4_ * fVar91;
            auVar41._8_4_ = local_a88._8_4_ * fVar92;
            auVar41._12_4_ = local_a88._12_4_ * fVar93;
            auVar49._0_4_ = local_a98._0_4_ * fVar105;
            auVar49._4_4_ = local_a98._4_4_ * fVar107;
            auVar49._8_4_ = local_a98._8_4_ * fVar108;
            auVar49._12_4_ = local_a98._12_4_ * fVar109;
            auVar66 = vfmsub213ps_fma(local_a98,local_8d8,auVar41);
            auVar74._0_4_ = fVar14 * auVar67._0_4_;
            auVar74._4_4_ = fVar15 * auVar67._4_4_;
            auVar74._8_4_ = fVar16 * auVar67._8_4_;
            auVar74._12_4_ = fVar17 * auVar67._12_4_;
            auVar81._0_4_ = fVar105 * auVar44._0_4_;
            auVar81._4_4_ = fVar107 * auVar44._4_4_;
            auVar81._8_4_ = fVar108 * auVar44._8_4_;
            auVar81._12_4_ = fVar109 * auVar44._12_4_;
            auVar44 = vfmsub213ps_fma(auVar44,local_8b8,auVar74);
            auVar61 = vandps_avx(auVar41,local_998);
            auVar32 = vandps_avx(auVar74,local_998);
            auVar61 = vcmpps_avx(auVar61,auVar32,1);
            local_808 = vblendvps_avx(auVar44,auVar66,auVar61);
            auVar75._0_4_ = fVar87 * auVar45._0_4_;
            auVar75._4_4_ = fVar91 * auVar45._4_4_;
            auVar75._8_4_ = fVar92 * auVar45._8_4_;
            auVar75._12_4_ = fVar93 * auVar45._12_4_;
            auVar66 = vfmsub213ps_fma(auVar45,local_8d8,auVar81);
            auVar42._0_4_ = local_a78._0_4_ * fVar14;
            auVar42._4_4_ = local_a78._4_4_ * fVar15;
            auVar42._8_4_ = local_a78._8_4_ * fVar16;
            auVar42._12_4_ = local_a78._12_4_ * fVar17;
            auVar44 = vfmsub213ps_fma(local_a88,local_8c8,auVar42);
            auVar61 = vandps_avx(auVar42,local_998);
            auVar32 = vandps_avx(auVar81,local_998);
            auVar61 = vcmpps_avx(auVar61,auVar32,1);
            local_7f8 = vblendvps_avx(auVar66,auVar44,auVar61);
            auVar66 = vfmsub213ps_fma(local_a78,local_8b8,auVar49);
            auVar67 = vfmsub213ps_fma(auVar67,local_8c8,auVar75);
            auVar61 = vandps_avx(auVar49,local_998);
            auVar32 = vandps_avx(auVar75,local_998);
            auVar61 = vcmpps_avx(auVar61,auVar32,1);
            local_7e8 = vblendvps_avx(auVar67,auVar66,auVar61);
            auVar56._0_4_ = local_7e8._0_4_ * local_ad8._4_4_;
            auVar56._4_4_ = local_7e8._4_4_ * local_ad8._4_4_;
            auVar56._8_4_ = local_7e8._8_4_ * local_ad8._4_4_;
            auVar56._12_4_ = local_7e8._12_4_ * local_ad8._4_4_;
            auVar61 = vfmadd213ps_fma(auVar94,local_7f8,auVar56);
            auVar61 = vfmadd213ps_fma(local_ab8,local_808,auVar61);
            auVar76._0_4_ = auVar61._0_4_ + auVar61._0_4_;
            auVar76._4_4_ = auVar61._4_4_ + auVar61._4_4_;
            auVar76._8_4_ = auVar61._8_4_ + auVar61._8_4_;
            auVar76._12_4_ = auVar61._12_4_ + auVar61._12_4_;
            auVar57._0_4_ = local_7e8._0_4_ * fVar4;
            auVar57._4_4_ = local_7e8._4_4_ * fVar51;
            auVar57._8_4_ = local_7e8._8_4_ * fVar12;
            auVar57._12_4_ = local_7e8._12_4_ * fVar13;
            auVar61 = vfmadd213ps_fma(local_a58,local_7f8,auVar57);
            auVar32 = vfmadd213ps_fma(local_a48,local_808,auVar61);
            auVar61 = vrcpps_avx(auVar76);
            auVar86._8_4_ = 0x3f800000;
            auVar86._0_8_ = 0x3f8000003f800000;
            auVar86._12_4_ = 0x3f800000;
            auVar66 = vfnmadd213ps_fma(auVar61,auVar76,auVar86);
            auVar61 = vfmadd132ps_fma(auVar66,auVar61,auVar61);
            local_818._0_4_ = auVar61._0_4_ * (auVar32._0_4_ + auVar32._0_4_);
            local_818._4_4_ = auVar61._4_4_ * (auVar32._4_4_ + auVar32._4_4_);
            local_818._8_4_ = auVar61._8_4_ * (auVar32._8_4_ + auVar32._8_4_);
            local_818._12_4_ = auVar61._12_4_ * (auVar32._12_4_ + auVar32._12_4_);
            uVar22 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
            auVar82._4_4_ = uVar22;
            auVar82._0_4_ = uVar22;
            auVar82._8_4_ = uVar22;
            auVar82._12_4_ = uVar22;
            auVar61 = vcmpps_avx(auVar82,local_818,2);
            fVar4 = ray->tfar;
            auVar88._4_4_ = fVar4;
            auVar88._0_4_ = fVar4;
            auVar88._8_4_ = fVar4;
            auVar88._12_4_ = fVar4;
            auVar32 = vcmpps_avx(local_818,auVar88,2);
            auVar61 = vandps_avx(auVar32,auVar61);
            auVar89._0_4_ = (uint)auVar76._0_4_ ^ local_9a8._0_4_;
            auVar89._4_4_ = (uint)auVar76._4_4_ ^ local_9a8._4_4_;
            auVar89._8_4_ = (uint)auVar76._8_4_ ^ local_9a8._8_4_;
            auVar89._12_4_ = (uint)auVar76._12_4_ ^ local_9a8._12_4_;
            auVar32 = vcmpps_avx(auVar89,auVar76,4);
            auVar61 = vandps_avx(auVar32,auVar61);
            auVar32 = vpand_avx(local_908,local_9b8);
            auVar61 = vpslld_avx(auVar61,0x1f);
            auVar61 = vpsrad_avx(auVar61,0x1f);
            local_848 = vpand_avx(auVar61,auVar32);
            uVar23 = vmovmskps_avx(local_848);
            if (uVar23 != 0) {
              local_858 = &local_ad9;
              auVar61 = vrcpps_avx(local_868);
              auVar50._8_4_ = 0x3f800000;
              auVar50._0_8_ = 0x3f8000003f800000;
              auVar50._12_4_ = 0x3f800000;
              auVar32 = vfnmadd213ps_fma(local_868,auVar61,auVar50);
              auVar32 = vfmadd132ps_fma(auVar32,auVar61,auVar61);
              auVar43._8_4_ = 0x219392ef;
              auVar43._0_8_ = 0x219392ef219392ef;
              auVar43._12_4_ = 0x219392ef;
              auVar61 = vcmpps_avx(local_8f8,auVar43,5);
              auVar61 = vandps_avx(auVar32,auVar61);
              auVar36._0_4_ = local_888 * auVar61._0_4_;
              auVar36._4_4_ = fStack_884 * auVar61._4_4_;
              auVar36._8_4_ = fStack_880 * auVar61._8_4_;
              auVar36._12_4_ = fStack_87c * auVar61._12_4_;
              local_838 = vminps_avx(auVar36,auVar50);
              auVar37._0_4_ = auVar61._0_4_ * local_878._0_4_;
              auVar37._4_4_ = auVar61._4_4_ * local_878._4_4_;
              auVar37._8_4_ = auVar61._8_4_ * local_878._8_4_;
              auVar37._12_4_ = auVar61._12_4_ * local_878._12_4_;
              local_828 = vminps_avx(auVar37,auVar50);
              uVar19 = (ulong)(uVar23 & 0xff);
              local_a30 = puVar29;
              do {
                uVar25 = 0;
                for (uVar18 = uVar19; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
                {
                  uVar25 = uVar25 + 1;
                }
                local_a00 = *(uint *)((long)&local_898 + uVar25 * 4);
                pGVar11 = (pSVar27->geometries).items[local_a00].ptr;
                if ((pGVar11->mask & ray->mask) == 0) {
                  uVar19 = uVar19 ^ 1L << (uVar25 & 0x3f);
                }
                else {
                  local_ad8 = (byte *)local_aa0->args;
                  if ((local_aa0->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_014a2345;
                  local_a68._0_8_ = uVar19;
                  local_a58._0_8_ = pSVar27;
                  local_a48._0_8_ = uVar26;
                  local_a78._0_8_ = uVar25;
                  uVar26 = (ulong)(uint)((int)uVar25 * 4);
                  local_9e8.context = local_aa0->user;
                  local_a18 = *(undefined4 *)(local_808 + uVar26);
                  local_a14 = *(undefined4 *)(local_7f8 + uVar26);
                  local_a10 = *(undefined4 *)(local_7e8 + uVar26);
                  local_a0c = *(undefined4 *)(local_838 + uVar26);
                  local_a08 = *(undefined4 *)(local_828 + uVar26);
                  local_a04 = *(undefined4 *)((long)&local_8a8 + uVar26);
                  local_9fc = (local_9e8.context)->instID[0];
                  local_9f8 = (local_9e8.context)->instPrimID[0];
                  local_a88._0_4_ = ray->tfar;
                  ray->tfar = *(float *)(local_818 + uVar26);
                  local_abc = -1;
                  local_9e8.valid = &local_abc;
                  local_9e8.geometryUserPtr = pGVar11->userPtr;
                  local_ab8._0_8_ = ray;
                  local_9e8.hit = (RTCHitN *)&local_a18;
                  local_9e8.N = 1;
                  local_a98._0_8_ = pGVar11;
                  local_9e8.ray = (RTCRayN *)ray;
                  if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar11->occlusionFilterN)(&local_9e8), *local_9e8.valid != 0)) {
                    ray = (Ray *)local_ab8._0_8_;
                    if ((*(code **)(local_ad8 + 0x10) == (code *)0x0) ||
                       (((*local_ad8 & 2) == 0 && ((*(byte *)(local_a98._0_8_ + 0x3e) & 0x40) == 0))
                       )) {
LAB_014a2345:
                      ray->tfar = -INFINITY;
                      return;
                    }
                    (**(code **)(local_ad8 + 0x10))(&local_9e8);
                    ray = (Ray *)local_ab8._0_8_;
                    if (*local_9e8.valid != 0) goto LAB_014a2345;
                  }
                  *(undefined4 *)(local_ab8._0_8_ + 0x20) = local_a88._0_4_;
                  uVar19 = local_a68._0_8_ ^ 1L << (local_a78._0_8_ & 0x3f);
                  pSVar27 = (Scene *)local_a58._0_8_;
                  ray = (Ray *)local_ab8._0_8_;
                  puVar29 = local_a30;
                  uVar26 = local_a48._0_8_;
                }
              } while (uVar19 != 0);
            }
          }
          auVar90 = ZEXT1664(local_918);
          auVar95 = ZEXT1664(local_928);
          auVar96 = ZEXT1664(local_938);
          auVar98 = ZEXT1664(local_948);
          auVar99 = ZEXT1664(local_958);
          auVar102 = ZEXT1664(local_968);
          auVar104 = ZEXT1664(local_978);
          auVar106 = ZEXT1664(local_988);
          context = local_aa0;
        }
        goto LAB_014a19a2;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }